

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-x509.c
# Opt level: O3

time_t lws_tls_openssl_asn1time_to_unix(ASN1_TIME *as)

{
  size_t sVar1;
  long lVar2;
  time_t tVar3;
  int iVar4;
  int iVar5;
  tm local_40;
  
  local_40.tm_gmtoff = 0;
  local_40.tm_zone = (char *)0x0;
  local_40.tm_wday = 0;
  local_40.tm_yday = 0;
  local_40.tm_isdst = 0;
  local_40._36_4_ = 0;
  sVar1 = strlen((char *)as);
  iVar5 = (int)(char)as->length;
  iVar4 = (int)*(char *)((long)&as->length + 1);
  if (sVar1 == 0xd) {
    local_40.tm_year = iVar4 + iVar5 * 10 + -0x1ac;
    lVar2 = 2;
  }
  else {
    local_40.tm_year =
         (int)*(char *)((long)&as->length + 3) +
         iVar4 * 100 + iVar5 * 1000 + *(char *)((long)&as->length + 2) * 10 + -0xd050;
    lVar2 = 4;
  }
  local_40.tm_mon =
       (int)*(char *)((long)&as->length + lVar2 + 1) + *(char *)((long)&as->length + lVar2) * 10 +
       -0x211;
  local_40.tm_mday =
       (int)*(char *)((long)&as->length + lVar2 + 3) + *(char *)((long)&as->length + lVar2 + 2) * 10
       + -0x211;
  local_40.tm_hour =
       (int)*(char *)((long)&as->type + lVar2 + 1) + *(char *)((long)&as->type + lVar2) * 10 +
       -0x210;
  local_40.tm_min =
       (int)*(char *)((long)&as->type + lVar2 + 3) + *(char *)((long)&as->type + lVar2 + 2) * 10 +
       -0x210;
  local_40.tm_sec =
       (int)*(char *)((long)&as->data + lVar2 + 1) + *(char *)((long)&as->data + lVar2) * 10 +
       -0x210;
  tVar3 = mktime(&local_40);
  return tVar3;
}

Assistant:

static time_t
lws_tls_openssl_asn1time_to_unix(ASN1_TIME *as)
{
#if !defined(LWS_PLAT_OPTEE)

	const char *p = (const char *)as->data;
	struct tm t;

	/* [YY]YYMMDDHHMMSSZ */

	memset(&t, 0, sizeof(t));

	if (strlen(p) == 13) {
		t.tm_year = (dec(p[0]) * 10) + dec(p[1]) + 100;
		p += 2;
	} else {
		t.tm_year = (dec(p[0]) * 1000) + (dec(p[1]) * 100) +
			    (dec(p[2]) * 10) + dec(p[3]);
		p += 4;
	}
	t.tm_mon = (dec(p[0]) * 10) + dec(p[1]) - 1;
	p += 2;
	t.tm_mday = (dec(p[0]) * 10) + dec(p[1]) - 1;
	p += 2;
	t.tm_hour = (dec(p[0]) * 10) + dec(p[1]);
	p += 2;
	t.tm_min = (dec(p[0]) * 10) + dec(p[1]);
	p += 2;
	t.tm_sec = (dec(p[0]) * 10) + dec(p[1]);
	t.tm_isdst = 0;

	return mktime(&t);
#else
	return (time_t)-1;
#endif
}